

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

void __thiscall bdQueryHistory::cleanupOldMsgs(bdQueryHistory *this)

{
  int iVar1;
  bool bVar2;
  time_t tVar3;
  iterator iVar4;
  iterator tit;
  iterator __position;
  
  if (this->mStorePeriod != 0) {
    tVar3 = time((time_t *)0x0);
    iVar1 = this->mStorePeriod;
    iVar4._M_node = (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (__position._M_node = iVar4._M_node,
          (_Rb_tree_header *)__position._M_node !=
          &(this->mHistory)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = bdQueryHistoryList::cleanupMsgs
                        ((bdQueryHistoryList *)&__position._M_node[2]._M_parent,tVar3 - iVar1);
      iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      if (bVar2) {
        std::
        _Rb_tree<bdId,std::pair<bdId_const,bdQueryHistoryList>,std::_Select1st<std::pair<bdId_const,bdQueryHistoryList>>,std::less<bdId>,std::allocator<std::pair<bdId_const,bdQueryHistoryList>>>
        ::erase_abi_cxx11_((_Rb_tree<bdId,std::pair<bdId_const,bdQueryHistoryList>,std::_Select1st<std::pair<bdId_const,bdQueryHistoryList>>,std::less<bdId>,std::allocator<std::pair<bdId_const,bdQueryHistoryList>>>
                            *)&this->mHistory,__position);
      }
    }
  }
  return;
}

Assistant:

void bdQueryHistory::cleanupOldMsgs() {
	if (mStorePeriod == 0)
		return; // no cleanup.

	time_t before = time(NULL) - mStorePeriod;
	std::map<bdId, bdQueryHistoryList>::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); ) {
		if (it->second.cleanupMsgs(before)) {
			std::map<bdId, bdQueryHistoryList>::iterator tit(it);
			++tit;
			mHistory.erase(it);
			it = tit;
		} else
            ++it;
	}
}